

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O3

void ym2612_reset_chip(void *chip)

{
  FM_OPN2 *OPN;
  int *piVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  long lVar12;
  byte bVar13;
  UINT8 *pUVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  double dVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  
  if (*(uint *)((long)chip + 0x22c) == 0) {
    dVar19 = 0.0;
  }
  else {
    dVar19 = ((double)*(uint *)((long)chip + 0x228) / (double)*(uint *)((long)chip + 0x22c)) / 144.0
    ;
  }
  OPN = (FM_OPN2 *)((long)chip + 0x208);
  uVar18 = -(ulong)(ABS(dVar19 + -1.0) < 5e-05);
  dVar19 = (double)(~uVar18 & (ulong)dVar19 | uVar18 & 0x3ff0000000000000);
  *(double *)((long)chip + 0x218) = dVar19;
  *(int *)((long)chip + 0x6c8) = (int)(long)(dVar19 * 65536.0);
  *(undefined4 *)((long)chip + 0x6cc) = 0x30000;
  *(int *)((long)chip + 0x46dc) = (int)(long)(dVar19 * 16777216.0);
  *(undefined4 *)((long)chip + 0x220) = 0x90;
  lVar12 = (long)chip + 0x44c;
  pUVar14 = "";
  lVar15 = 0;
  do {
    lVar17 = 0;
    do {
      uVar4 = *(undefined4 *)(pUVar14 + lVar17);
      uVar18 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar5._8_4_ = 0;
      auVar5._0_8_ = uVar18;
      auVar5[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar6[8] = (char)((uint)uVar4 >> 0x10);
      auVar6._0_8_ = uVar18;
      auVar6[9] = 0;
      auVar6._10_3_ = auVar5._10_3_;
      auVar8._5_8_ = 0;
      auVar8._0_5_ = auVar6._8_5_;
      auVar7[4] = (char)((uint)uVar4 >> 8);
      auVar7._0_4_ = (int)uVar18;
      auVar7[5] = 0;
      auVar7._6_7_ = SUB137(auVar8 << 0x40,6);
      iVar20 = (int)((double)(int)uVar18 * dVar19 * 64.0);
      iVar21 = (int)((double)auVar7._4_4_ * dVar19 * 64.0);
      iVar22 = (int)((double)auVar6._8_4_ * dVar19 * 64.0);
      iVar23 = (int)((double)(uint3)(auVar5._10_3_ >> 0x10) * dVar19 * 64.0);
      puVar2 = (undefined8 *)(lVar12 + -0x200 + lVar17 * 4);
      *puVar2 = CONCAT44(iVar21,iVar20);
      puVar2[1] = CONCAT44(iVar23,iVar22);
      piVar1 = (int *)(lVar12 + lVar17 * 4);
      *piVar1 = -iVar20;
      piVar1[1] = -iVar21;
      piVar1[2] = -iVar22;
      piVar1[3] = -iVar23;
      auVar10 = _DAT_00173c50;
      auVar9 = _DAT_00173c20;
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x20);
    lVar15 = lVar15 + 1;
    pUVar14 = pUVar14 + 0x20;
    lVar12 = lVar12 + 0x80;
  } while (lVar15 != 4);
  iVar20 = 0;
  iVar21 = 1;
  iVar22 = 2;
  iVar23 = 3;
  lVar12 = 0;
  do {
    auVar25._4_4_ = 0;
    auVar25._0_4_ = iVar20 << 5;
    auVar25._8_4_ = iVar21 << 5;
    auVar25._12_4_ = 0;
    auVar28._4_4_ = 0;
    auVar28._0_4_ = iVar22 << 5;
    auVar28._8_4_ = iVar23 << 5;
    auVar28._12_4_ = 0;
    dVar24 = (SUB168(auVar25 | auVar9,0) - auVar9._0_8_) * dVar19 * 64.0;
    dVar26 = (SUB168(auVar25 | auVar9,8) - auVar9._8_8_) * dVar19 * 64.0;
    dVar27 = (SUB168(auVar28 | auVar9,0) - auVar9._0_8_) * dVar19 * 64.0;
    dVar29 = (SUB168(auVar28 | auVar9,8) - auVar9._8_8_) * dVar19 * 64.0;
    iVar30 = (int)dVar27;
    iVar32 = (int)dVar29;
    iVar31 = (int)dVar24;
    iVar33 = (int)dVar26;
    puVar3 = (ulong *)((long)chip + lVar12 * 4 + 0x6d0);
    *puVar3 = CONCAT44((int)(dVar26 - 2147483648.0),(int)(dVar24 - 2147483648.0)) &
              CONCAT44(iVar33 >> 0x1f,iVar31 >> 0x1f) | CONCAT44(iVar33,iVar31);
    puVar3[1] = CONCAT44((int)(dVar29 - 2147483648.0),(int)(dVar27 - 2147483648.0)) &
                CONCAT44(iVar32 >> 0x1f,iVar30 >> 0x1f) | CONCAT44(iVar32,iVar30);
    lVar12 = lVar12 + 4;
    iVar20 = iVar20 + auVar10._0_4_;
    iVar21 = iVar21 + auVar10._4_4_;
    iVar22 = iVar22 + auVar10._8_4_;
    iVar23 = iVar23 + auVar10._12_4_;
  } while (lVar12 != 0x1000);
  *(int *)((long)chip + 0x46d0) = (int)(long)(dVar19 * 131072.0 * 64.0);
  *(undefined1 *)((long)chip + 0x225) = 3;
  bVar13 = *(byte *)((long)chip + 0x231);
  bVar11 = 3;
  if (*(char *)((long)chip + 0x224) == '\0') {
    if ((bVar13 & 3) == 0) goto LAB_00130aef;
    *(undefined1 *)((long)chip + 0x224) = 1;
    if (*(code **)((long)chip + 0x658) != (code *)0x0) {
      (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210));
      if (*(char *)((long)chip + 0x224) == '\0') goto LAB_00130aef;
      bVar11 = *(byte *)((long)chip + 0x225);
      bVar13 = *(byte *)((long)chip + 0x231);
    }
  }
  if ((bVar13 & bVar11) == 0) {
    *(undefined1 *)((long)chip + 0x224) = 0;
    if (*(code **)((long)chip + 0x658) != (code *)0x0) {
      (**(code **)((long)chip + 0x658))(*(undefined8 *)((long)chip + 0x210));
    }
  }
LAB_00130aef:
  *(undefined8 *)((long)chip + 0x6c0) = 0;
  *(undefined4 *)((long)chip + 0x240) = 0;
  *(undefined4 *)((long)chip + 0x248) = 0;
  *(undefined1 *)((long)chip + 0x684) = 0;
  *(undefined1 *)((long)chip + 0x231) = 0;
  *(undefined4 *)((long)chip + 0x234) = 0;
  memset((void *)((long)chip + 8),0,0x200);
  *(undefined4 *)((long)chip + 0x46e0) = 0;
  *(undefined4 *)((long)chip + 0x46d8) = 0;
  *(undefined1 *)((long)chip + 0x46d4) = 0;
  *(undefined8 *)((long)chip + 0x46e4) = 0x7e;
  OPNWriteMode(OPN,0x27,0x30);
  *(undefined1 *)((long)chip + 0x244) = 0;
  *(undefined4 *)((long)chip + 0x23c) = 0;
  lVar12 = (long)chip + 0x4762;
  lVar15 = 0;
  do {
    lVar17 = lVar15 * 0x198;
    *(undefined4 *)((long)chip + lVar17 + 0x4890) = 0;
    *(undefined8 *)((long)chip + lVar17 + 0x485c) = 0;
    *(undefined4 *)((long)chip + lVar17 + 0x489c) = 0;
    lVar17 = 0;
    do {
      *(long *)(lVar12 + -0x4a + lVar17) = (long)chip + 0x24c;
      *(undefined1 *)(lVar12 + lVar17) = 0;
      *(undefined8 *)(lVar12 + -0x26 + lVar17) = 0xffffffff00000000;
      *(undefined2 *)(lVar12 + -2 + lVar17) = 0;
      *(undefined1 *)(lVar12 + -0x1e + lVar17) = 0;
      *(undefined4 *)(lVar12 + -0x16 + lVar17) = 0x3ff;
      *(undefined4 *)(lVar12 + -0xe + lVar17) = 0x3ff;
      lVar17 = lVar17 + 0x50;
    } while (lVar17 != 0x140);
    lVar15 = lVar15 + 1;
    lVar12 = lVar12 + 0x198;
  } while (lVar15 != 6);
  uVar16 = 0xb7;
  do {
    uVar16 = uVar16 - 1;
    OPNWriteReg(OPN,uVar16,0xc0);
    OPNWriteReg(OPN,uVar16 | 0x100,0xc0);
  } while (0xb4 < uVar16);
  uVar16 = 0xb3;
  do {
    uVar16 = uVar16 - 1;
    OPNWriteReg(OPN,uVar16,0);
    OPNWriteReg(OPN,uVar16 | 0x100,0);
  } while (0x30 < uVar16);
  *(undefined2 *)((long)chip + 0x50a9) = 0;
  *(undefined4 *)((long)chip + 0x50ac) = 0;
  *(byte *)((long)chip + 0x50b1) = *(byte *)((long)chip + 0x50b1) >> 1;
  *(undefined8 *)((long)chip + 0x50b4) = 0;
  return;
}

Assistant:

void ym2612_reset_chip(void *chip)
{
	int i;
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN2 *OPN  = &F2612->OPN;

	OPNSetPres( OPN, 6*24, 6*24, 0);
	/* status clear */
	FM_IRQMASK_SET(&OPN->ST,0x03);
	FM_BUSY_CLEAR(&OPN->ST);
	//OPNWriteMode(OPN,0x27,0x30); /* mode 0 , timer reset */

	OPN->eg_timer = 0;
	OPN->eg_cnt   = 0;

	OPN->lfo_timer = 0;
	OPN->lfo_cnt   = 0;
	OPN->LFO_AM    = 126;
	OPN->LFO_PM    = 0;

	OPN->ST.TAC    = 0;
	OPN->ST.TBC    = 0;

	OPN->SL3.key_csm = 0;

	OPN->ST.status = 0;
	OPN->ST.mode = 0;

	memset(F2612->REGS, 0x00, sizeof(UINT8) * 512);
	
	OPNWriteMode(OPN,0x22,0x00);
	
	OPNWriteMode(OPN,0x27,0x30);
	OPNWriteMode(OPN,0x26,0x00);
	OPNWriteMode(OPN,0x25,0x00);
	OPNWriteMode(OPN,0x24,0x00);

	reset_channels( &OPN->ST , &F2612->CH[0] , 6 );

	for(i = 0xb6 ; i >= 0xb4 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0xc0);
		OPNWriteReg(OPN,i|0x100,0xc0);
	}
	for(i = 0xb2 ; i >= 0x30 ; i-- )
	{
		OPNWriteReg(OPN,i      ,0);
		OPNWriteReg(OPN,i|0x100,0);
	}

	/* DAC mode clear */
	F2612->dacen = 0;
	F2612->dac_test = 0;
	F2612->dacout = 0;
	
	F2612->WaveOutMode >>= 1;
	F2612->WaveL = F2612->WaveR = 0;
}